

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_skein.c
# Opt level: O2

int Skein_512_Final(Skein_512_Ctxt_t *ctx,u08b_t *hashVal)

{
  byte *pbVar1;
  u64b_t uVar2;
  u64b_t uVar3;
  u64b_t uVar4;
  u64b_t uVar5;
  u64b_t uVar6;
  u64b_t uVar7;
  u64b_t uVar8;
  u64b_t uVar9;
  void *extraout_RAX;
  void *pvVar10;
  ulong uVar11;
  size_t __n;
  ulong uVar12;
  ulong uVar13;
  u64b_t X [8];
  
  pbVar1 = (byte *)((long)(ctx->h).T + 0xf);
  *pbVar1 = *pbVar1 | 0x80;
  uVar11 = (ctx->h).bCnt;
  if (uVar11 < 0x40) {
    memset(ctx->b + uVar11,0,0x40 - uVar11);
    uVar11 = (ctx->h).bCnt;
  }
  Skein_512_Process_Block(ctx,ctx->b,1,uVar11);
  uVar12 = (ctx->h).hashBitLen + 7 >> 3;
  ctx->b[0] = '\0';
  ctx->b[1] = '\0';
  ctx->b[2] = '\0';
  ctx->b[3] = '\0';
  ctx->b[4] = '\0';
  ctx->b[5] = '\0';
  ctx->b[6] = '\0';
  ctx->b[7] = '\0';
  ctx->b[8] = '\0';
  ctx->b[9] = '\0';
  ctx->b[10] = '\0';
  ctx->b[0xb] = '\0';
  ctx->b[0xc] = '\0';
  ctx->b[0xd] = '\0';
  ctx->b[0xe] = '\0';
  ctx->b[0xf] = '\0';
  ctx->b[0x10] = '\0';
  ctx->b[0x11] = '\0';
  ctx->b[0x12] = '\0';
  ctx->b[0x13] = '\0';
  ctx->b[0x14] = '\0';
  ctx->b[0x15] = '\0';
  ctx->b[0x16] = '\0';
  ctx->b[0x17] = '\0';
  ctx->b[0x18] = '\0';
  ctx->b[0x19] = '\0';
  ctx->b[0x1a] = '\0';
  ctx->b[0x1b] = '\0';
  ctx->b[0x1c] = '\0';
  ctx->b[0x1d] = '\0';
  ctx->b[0x1e] = '\0';
  ctx->b[0x1f] = '\0';
  ctx->b[0x20] = '\0';
  ctx->b[0x21] = '\0';
  ctx->b[0x22] = '\0';
  ctx->b[0x23] = '\0';
  ctx->b[0x24] = '\0';
  ctx->b[0x25] = '\0';
  ctx->b[0x26] = '\0';
  ctx->b[0x27] = '\0';
  ctx->b[0x28] = '\0';
  ctx->b[0x29] = '\0';
  ctx->b[0x2a] = '\0';
  ctx->b[0x2b] = '\0';
  ctx->b[0x2c] = '\0';
  ctx->b[0x2d] = '\0';
  ctx->b[0x2e] = '\0';
  ctx->b[0x2f] = '\0';
  ctx->b[0x30] = '\0';
  ctx->b[0x31] = '\0';
  ctx->b[0x32] = '\0';
  ctx->b[0x33] = '\0';
  ctx->b[0x34] = '\0';
  ctx->b[0x35] = '\0';
  ctx->b[0x36] = '\0';
  ctx->b[0x37] = '\0';
  ctx->b[0x38] = '\0';
  ctx->b[0x39] = '\0';
  ctx->b[0x3a] = '\0';
  ctx->b[0x3b] = '\0';
  ctx->b[0x3c] = '\0';
  ctx->b[0x3d] = '\0';
  ctx->b[0x3e] = '\0';
  ctx->b[0x3f] = '\0';
  uVar2 = ctx->X[6];
  uVar3 = ctx->X[7];
  uVar4 = ctx->X[4];
  uVar5 = ctx->X[5];
  uVar6 = ctx->X[2];
  uVar7 = ctx->X[3];
  uVar8 = ctx->X[0];
  uVar9 = ctx->X[1];
  uVar11 = uVar12 + 0x3f;
  pvVar10 = extraout_RAX;
  for (uVar13 = 0; uVar11 >> 6 != uVar13; uVar13 = uVar13 + 1) {
    *(ulong *)ctx->b = uVar13;
    (ctx->h).T[1] = 0xff00000000000000;
    (ctx->h).bCnt = 0;
    (ctx->h).T[0] = 0;
    Skein_512_Process_Block(ctx,ctx->b,1,8);
    __n = 0x40;
    if (uVar12 < 0x40) {
      __n = uVar12;
    }
    pvVar10 = memcpy(hashVal,ctx->X,__n);
    ctx->X[0] = uVar8;
    ctx->X[1] = uVar9;
    ctx->X[2] = uVar6;
    ctx->X[3] = uVar7;
    ctx->X[4] = uVar4;
    ctx->X[5] = uVar5;
    ctx->X[6] = uVar2;
    ctx->X[7] = uVar3;
    hashVal = hashVal + 0x40;
    uVar12 = uVar12 - 0x40;
  }
  return (int)pvVar10;
}

Assistant:

static int Skein_512_Final(Skein_512_Ctxt_t *ctx, u08b_t *hashVal)
    {
    size_t i,n,byteCnt;
    u64b_t X[SKEIN_512_STATE_WORDS];
    Skein_Assert(ctx->h.bCnt <= SKEIN_512_BLOCK_BYTES,SKEIN_FAIL);    /* catch uninitialized context */

    ctx->h.T[1] |= SKEIN_T1_FLAG_FINAL;                 /* tag as the final block */
    if (ctx->h.bCnt < SKEIN_512_BLOCK_BYTES)            /* zero pad b[] if necessary */
        memset(&ctx->b[ctx->h.bCnt],0,SKEIN_512_BLOCK_BYTES - ctx->h.bCnt);

    Skein_512_Process_Block(ctx,ctx->b,1,ctx->h.bCnt);  /* process the final block */
    
    /* now output the result */
    byteCnt = (ctx->h.hashBitLen + 7) >> 3;             /* total number of output bytes */

    /* run Threefish in "counter mode" to generate output */
    memset(ctx->b,0,sizeof(ctx->b));  /* zero out b[], so it can hold the counter */
    memcpy(X,ctx->X,sizeof(X));       /* keep a local copy of counter mode "key" */
    for (i=0;i*SKEIN_512_BLOCK_BYTES < byteCnt;i++)
        {
        ((u64b_t *)ctx->b)[0]= Skein_Swap64((u64b_t) i); /* build the counter block */
        Skein_Start_New_Type(ctx,OUT_FINAL);
        Skein_512_Process_Block(ctx,ctx->b,1,sizeof(u64b_t)); /* run "counter mode" */
        n = byteCnt - i*SKEIN_512_BLOCK_BYTES;   /* number of output bytes left to go */
        if (n >= SKEIN_512_BLOCK_BYTES)
            n  = SKEIN_512_BLOCK_BYTES;
        Skein_Put64_LSB_First(hashVal+i*SKEIN_512_BLOCK_BYTES,ctx->X,n);   /* "output" the ctr mode bytes */
        Skein_Show_Final(512,&ctx->h,n,hashVal+i*SKEIN_512_BLOCK_BYTES);
        memcpy(ctx->X,X,sizeof(X));   /* restore the counter mode key for next time */
        }
    return SKEIN_SUCCESS;
    }